

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_setop_node.cpp
# Opt level: O0

unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true> __thiscall
duckdb::Binder::BindNode(Binder *this,SetOperationNode *statement)

{
  SetOperationType SVar1;
  byte bVar2;
  bool bVar3;
  pointer pBVar4;
  idx_t iVar5;
  Binder *pBVar6;
  Binder *result_00;
  type table_index;
  pointer sql_types;
  pointer pBVar7;
  SelectBindState *pSVar8;
  type reorder_idx_00;
  pointer pBVar9;
  size_type sVar10;
  size_type sVar11;
  undefined8 uVar12;
  long in_RDX;
  Binder *in_RSI;
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_> in_RDI;
  bool in_stack_000000b7;
  BoundSetOperationNode *in_stack_000000b8;
  ClientContext *in_stack_000000c0;
  OrderBinder order_binder;
  vector<std::reference_wrapper<duckdb::Binder>,_true> binders;
  idx_t i_1;
  vector<unsigned_long,_true> reorder_idx;
  SelectBindState bind_state;
  LogicalType result_type;
  idx_t i;
  templated_unique_single_t result;
  Binder *in_stack_fffffffffffffa98;
  Binder *in_stack_fffffffffffffaa0;
  value_type *in_stack_fffffffffffffaa8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_stack_fffffffffffffab0;
  SelectBindState *in_stack_fffffffffffffac0;
  Binder *in_stack_fffffffffffffac8;
  BoundQueryNode *in_stack_fffffffffffffad0;
  LogicalType *in_stack_fffffffffffffad8;
  LogicalType *in_stack_fffffffffffffb00;
  LogicalType *in_stack_fffffffffffffb08;
  QueryNode *in_stack_fffffffffffffb10;
  Binder *in_stack_fffffffffffffb18;
  undefined8 in_stack_fffffffffffffb38;
  BinderType binder_type;
  ClientContext *in_stack_fffffffffffffb40;
  optional_ptr<duckdb::Binder,_true> in_stack_fffffffffffffb48;
  BoundQueryNode *node;
  SelectBindState *bind_state_00;
  ulong local_238;
  BoundQueryNode *in_stack_fffffffffffffe98;
  QueryNode *in_stack_fffffffffffffea0;
  OrderBinder *in_stack_fffffffffffffea8;
  Binder *in_stack_fffffffffffffeb0;
  ulong local_a0;
  allocator local_91;
  string local_90 [32];
  long local_18;
  
  binder_type = (BinderType)((ulong)in_stack_fffffffffffffb38 >> 0x38);
  local_18 = in_RDX;
  make_uniq<duckdb::BoundSetOperationNode>();
  SVar1 = *(SetOperationType *)(local_18 + 0x78);
  pBVar4 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
           ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                         *)in_stack_fffffffffffffaa0);
  pBVar4->setop_type = SVar1;
  bVar2 = *(byte *)(local_18 + 0x79);
  pBVar4 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
           ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                         *)in_stack_fffffffffffffaa0);
  pBVar4->setop_all = (bool)(bVar2 & 1);
  iVar5 = GenerateTableIndex(in_stack_fffffffffffffaa0);
  pBVar4 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
           ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                         *)in_stack_fffffffffffffaa0);
  pBVar4->setop_index = iVar5;
  optional_ptr<duckdb::Binder,_true>::optional_ptr
            ((optional_ptr<duckdb::Binder,_true> *)&stack0xffffffffffffffb8,in_RSI);
  CreateBinder(in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,binder_type);
  unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
  ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                *)in_stack_fffffffffffffaa0);
  shared_ptr<duckdb::Binder,_true>::operator=
            ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffab0,
             (shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffaa8);
  shared_ptr<duckdb::Binder,_true>::~shared_ptr((shared_ptr<duckdb::Binder,_true> *)0x19df12b);
  unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
  ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                *)in_stack_fffffffffffffaa0);
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffaa0);
  pBVar6->can_contain_nulls = true;
  unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
  ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                *)in_stack_fffffffffffffaa0);
  shared_ptr<duckdb::Binder,_true>::operator->
            ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffaa0);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             in_stack_fffffffffffffaa0);
  BindNode(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
  ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                *)in_stack_fffffffffffffaa0);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator=
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)in_stack_fffffffffffffaa0,
             (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)in_stack_fffffffffffffa98);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::~unique_ptr
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)0x19df21d);
  optional_ptr<duckdb::Binder,_true>::optional_ptr
            ((optional_ptr<duckdb::Binder,_true> *)&stack0xffffffffffffff98,in_RSI);
  CreateBinder(in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,binder_type);
  unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
  ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                *)in_stack_fffffffffffffaa0);
  shared_ptr<duckdb::Binder,_true>::operator=
            ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffab0,
             (shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffaa8);
  shared_ptr<duckdb::Binder,_true>::~shared_ptr((shared_ptr<duckdb::Binder,_true> *)0x19df2a9);
  unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
  ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                *)in_stack_fffffffffffffaa0);
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffaa0);
  pBVar6->can_contain_nulls = true;
  pBVar6 = (Binder *)
           unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
           ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                         *)in_stack_fffffffffffffaa0);
  result_00 = shared_ptr<duckdb::Binder,_true>::operator->
                        ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffaa0);
  table_index = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
                operator*((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                           *)in_stack_fffffffffffffaa0);
  BindNode(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  pBVar4 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
           ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                         *)in_stack_fffffffffffffaa0);
  bind_state_00 = (SelectBindState *)&stack0xffffffffffffff90;
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator=
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)in_stack_fffffffffffffaa0,
             (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)in_stack_fffffffffffffa98);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::~unique_ptr
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)0x19df3a4);
  sql_types = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
              ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                            *)in_stack_fffffffffffffaa0);
  pBVar7 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
           operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                       *)in_stack_fffffffffffffaa0);
  node = (BoundQueryNode *)&pBVar7->names;
  unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
  ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                *)in_stack_fffffffffffffaa0);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_stack_fffffffffffffaa0,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_stack_fffffffffffffa98);
  pSVar8 = (SelectBindState *)
           unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
           ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                         *)in_stack_fffffffffffffaa0);
  reorder_idx_00 =
       shared_ptr<duckdb::Binder,_true>::operator*
                 ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffaa0);
  MoveCorrelatedExpressions(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
  ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                *)in_stack_fffffffffffffaa0);
  shared_ptr<duckdb::Binder,_true>::operator*
            ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffaa0);
  MoveCorrelatedExpressions(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  pBVar9 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
           ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                         *)in_stack_fffffffffffffaa0);
  if (pBVar9->setop_type != UNION_BY_NAME) {
    unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
    ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                  *)in_stack_fffffffffffffaa0);
    pBVar7 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                         *)in_stack_fffffffffffffaa0);
    sVar10 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                       (&(pBVar7->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
    ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                  *)in_stack_fffffffffffffaa0);
    pBVar7 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                         *)in_stack_fffffffffffffaa0);
    sVar11 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                       (&(pBVar7->types).
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    if (sVar10 != sVar11) {
      uVar12 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_90,
                 "Set operations can only apply to expressions with the same number of result columns"
                 ,&local_91);
      BinderException::BinderException
                ((BinderException *)in_stack_fffffffffffffaa0,(string *)in_stack_fffffffffffffa98);
      __cxa_throw(uVar12,&BinderException::typeinfo,BinderException::~BinderException);
    }
  }
  pBVar9 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
           ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                         *)in_stack_fffffffffffffaa0);
  if (pBVar9->setop_type == UNION_BY_NAME) {
    unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
    ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                 *)in_stack_fffffffffffffaa0);
    BuildUnionByNameInfo(in_stack_000000c0,in_stack_000000b8,in_stack_000000b7);
  }
  else {
    local_a0 = 0;
    while( true ) {
      unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
      ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                    *)in_stack_fffffffffffffaa0);
      pBVar7 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
               ::operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                             *)in_stack_fffffffffffffaa0);
      sVar10 = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                         (&(pBVar7->types).
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      if (sVar10 <= local_a0) break;
      unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
      ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                    *)in_stack_fffffffffffffaa0);
      unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
      operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                  *)in_stack_fffffffffffffaa0);
      vector<duckdb::LogicalType,_true>::operator[]
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffaa0,
                 (size_type)in_stack_fffffffffffffa98);
      unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
      ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                    *)in_stack_fffffffffffffaa0);
      unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
      operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                  *)in_stack_fffffffffffffaa0);
      vector<duckdb::LogicalType,_true>::operator[]
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffaa0,
                 (size_type)in_stack_fffffffffffffa98);
      LogicalType::ForceMaxLogicalType(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      if (((in_RSI->can_contain_nulls & 1U) == 0) &&
         (bVar3 = ExpressionBinder::ContainsNullType((LogicalType *)0x19df8f7), bVar3)) {
        ExpressionBinder::ExchangeNullType(in_stack_fffffffffffffad8);
        LogicalType::operator=
                  ((LogicalType *)in_stack_fffffffffffffaa0,(LogicalType *)in_stack_fffffffffffffa98
                  );
        LogicalType::~LogicalType((LogicalType *)0x19df946);
      }
      unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
      ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                    *)in_stack_fffffffffffffaa0);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
      LogicalType::~LogicalType((LogicalType *)0x19df9af);
      local_a0 = local_a0 + 1;
    }
  }
  SelectBindState::SelectBindState((SelectBindState *)in_stack_fffffffffffffaa0);
  bVar3 = ::std::
          vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
          ::empty((vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
                   *)in_stack_fffffffffffffab0);
  if (!bVar3) {
    pBVar9 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
             ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                           *)in_stack_fffffffffffffaa0);
    if (pBVar9->setop_type == UNION_BY_NAME) {
      unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
      ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                    *)in_stack_fffffffffffffaa0);
      unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
      operator*((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                 *)in_stack_fffffffffffffaa0);
      unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
      ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                    *)in_stack_fffffffffffffaa0);
      GatherAliases(node,pSVar8,(vector<unsigned_long,_true> *)reorder_idx_00);
      unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
      ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                    *)in_stack_fffffffffffffaa0);
      unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
      operator*((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                 *)in_stack_fffffffffffffaa0);
      unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
      ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                    *)in_stack_fffffffffffffaa0);
      GatherAliases(node,pSVar8,(vector<unsigned_long,_true> *)reorder_idx_00);
    }
    else {
      vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x19dfb22);
      local_238 = 0;
      while( true ) {
        pBVar9 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                 ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                               *)in_stack_fffffffffffffaa0);
        sVar10 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&(pBVar9->super_BoundQueryNode).names);
        if (sVar10 <= local_238) break;
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffab0,(value_type_conflict1 *)in_stack_fffffffffffffaa8);
        local_238 = local_238 + 1;
      }
      unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
      ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                   *)in_stack_fffffffffffffaa0);
      GatherAliases(node,pSVar8,(vector<unsigned_long,_true> *)reorder_idx_00);
      vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x19dfc0e);
    }
    vector<std::reference_wrapper<duckdb::Binder>,_true>::vector
              ((vector<std::reference_wrapper<duckdb::Binder>,_true> *)0x19dfc1b);
    unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
    ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                  *)in_stack_fffffffffffffaa0);
    unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
              ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                *)in_stack_fffffffffffffaa0);
    unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
    ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                  *)in_stack_fffffffffffffaa0);
    shared_ptr<duckdb::Binder,_true>::operator*
              ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffaa0);
    GatherSetOpBinders(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                       (vector<std::reference_wrapper<duckdb::Binder>,_true> *)
                       in_stack_fffffffffffffac0);
    unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
    ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                  *)in_stack_fffffffffffffaa0);
    unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
              ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                *)in_stack_fffffffffffffaa0);
    unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
    ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                  *)in_stack_fffffffffffffaa0);
    shared_ptr<duckdb::Binder,_true>::operator*
              ((shared_ptr<duckdb::Binder,_true> *)in_stack_fffffffffffffaa0);
    GatherSetOpBinders(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                       (vector<std::reference_wrapper<duckdb::Binder>,_true> *)
                       in_stack_fffffffffffffac0);
    vector<std::reference_wrapper<duckdb::Binder>,_true>::vector
              ((vector<std::reference_wrapper<duckdb::Binder>,_true> *)in_stack_fffffffffffffaa0,
               (vector<std::reference_wrapper<duckdb::Binder>,_true> *)in_stack_fffffffffffffa98);
    OrderBinder::OrderBinder
              ((OrderBinder *)in_stack_fffffffffffffad0,
               (vector<std::reference_wrapper<duckdb::Binder>,_true> *)in_stack_fffffffffffffac8,
               in_stack_fffffffffffffac0);
    vector<std::reference_wrapper<duckdb::Binder>,_true>::~vector
              ((vector<std::reference_wrapper<duckdb::Binder>,_true> *)0x19dfd3d);
    unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
    ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                 *)in_stack_fffffffffffffaa0);
    PrepareModifiers(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe98);
    OrderBinder::~OrderBinder((OrderBinder *)in_stack_fffffffffffffaa0);
    vector<std::reference_wrapper<duckdb::Binder>,_true>::~vector
              ((vector<std::reference_wrapper<duckdb::Binder>,_true> *)0x19dfd99);
  }
  unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
  ::operator*((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
               *)in_stack_fffffffffffffaa0);
  unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
  ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                *)in_stack_fffffffffffffaa0);
  pBVar9 = unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
           ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                         *)in_stack_fffffffffffffaa0);
  pSVar8 = (SelectBindState *)&(pBVar9->super_BoundQueryNode).names;
  unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
  ::operator->((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                *)pSVar8);
  BindModifiers(pBVar6,(BoundQueryNode *)result_00,(idx_t)table_index,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)pBVar4,(vector<duckdb::LogicalType,_true> *)sql_types,bind_state_00);
  unique_ptr<duckdb::BoundQueryNode,std::default_delete<duckdb::BoundQueryNode>,true>::
  unique_ptr<duckdb::BoundSetOperationNode,std::default_delete<std::unique_ptr<duckdb::BoundQueryNode,std::default_delete<duckdb::BoundQueryNode>>>,void>
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)pSVar8,
             (unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>_>
              *)in_stack_fffffffffffffa98);
  SelectBindState::~SelectBindState(pSVar8);
  unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
  ::~unique_ptr((unique_ptr<duckdb::BoundSetOperationNode,_std::default_delete<duckdb::BoundSetOperationNode>,_true>
                 *)0x19dfed1);
  return (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>)
         (__uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
         .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BoundQueryNode> Binder::BindNode(SetOperationNode &statement) {
	auto result = make_uniq<BoundSetOperationNode>();
	result->setop_type = statement.setop_type;
	result->setop_all = statement.setop_all;

	// first recursively visit the set operations
	// both the left and right sides have an independent BindContext and Binder
	D_ASSERT(statement.left);
	D_ASSERT(statement.right);

	result->setop_index = GenerateTableIndex();

	result->left_binder = Binder::CreateBinder(context, this);
	result->left_binder->can_contain_nulls = true;
	result->left = result->left_binder->BindNode(*statement.left);
	result->right_binder = Binder::CreateBinder(context, this);
	result->right_binder->can_contain_nulls = true;
	result->right = result->right_binder->BindNode(*statement.right);

	result->names = result->left->names;

	// move the correlated expressions from the child binders to this binder
	MoveCorrelatedExpressions(*result->left_binder);
	MoveCorrelatedExpressions(*result->right_binder);

	// now both sides have been bound we can resolve types
	if (result->setop_type != SetOperationType::UNION_BY_NAME &&
	    result->left->types.size() != result->right->types.size()) {
		throw BinderException("Set operations can only apply to expressions with the "
		                      "same number of result columns");
	}

	if (result->setop_type == SetOperationType::UNION_BY_NAME) {
		BuildUnionByNameInfo(context, *result, can_contain_nulls);
	} else {
		// figure out the types of the setop result by picking the max of both
		for (idx_t i = 0; i < result->left->types.size(); i++) {
			auto result_type = LogicalType::ForceMaxLogicalType(result->left->types[i], result->right->types[i]);
			if (!can_contain_nulls) {
				if (ExpressionBinder::ContainsNullType(result_type)) {
					result_type = ExpressionBinder::ExchangeNullType(result_type);
				}
			}
			result->types.push_back(result_type);
		}
	}

	SelectBindState bind_state;
	if (!statement.modifiers.empty()) {
		// handle the ORDER BY/DISTINCT clauses

		// we recursively visit the children of this node to extract aliases and expressions that can be referenced
		// in the ORDER BY

		if (result->setop_type == SetOperationType::UNION_BY_NAME) {
			GatherAliases(*result->left, bind_state, result->left_reorder_idx);
			GatherAliases(*result->right, bind_state, result->right_reorder_idx);
		} else {
			vector<idx_t> reorder_idx;
			for (idx_t i = 0; i < result->names.size(); i++) {
				reorder_idx.push_back(i);
			}
			GatherAliases(*result, bind_state, reorder_idx);
		}
		// now we perform the actual resolution of the ORDER BY/DISTINCT expressions
		vector<reference<Binder>> binders;
		GatherSetOpBinders(*result->left, *result->left_binder, binders);
		GatherSetOpBinders(*result->right, *result->right_binder, binders);
		OrderBinder order_binder(binders, bind_state);
		PrepareModifiers(order_binder, statement, *result);
	}

	// finally bind the types of the ORDER/DISTINCT clause expressions
	BindModifiers(*result, result->setop_index, result->names, result->types, bind_state);
	return std::move(result);
}